

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::UnorderedFixedStorage<wasm::Name,_10UL>::UnorderedFixedStorage
          (UnorderedFixedStorage<wasm::Name,_10UL> *this)

{
  UnorderedFixedStorage<wasm::Name,_10UL> *this_local;
  
  FixedStorageBase<wasm::Name,_10UL>::FixedStorageBase
            (&this->super_FixedStorageBase<wasm::Name,_10UL>);
  return;
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }